

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O1

output_type *
testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::generate
          (size_t generation,unsigned_long randomSeed)

{
  ulong in_RSI;
  back_insert_iterator<std::__cxx11::list<int,_std::allocator<int>_>_> in_RDI;
  anon_class_16_2_2856ea55 __gen;
  unsigned_long local_28;
  size_t local_20;
  
  ((in_RDI.container)->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)in_RDI.container;
  ((in_RDI.container)->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)in_RDI.container;
  ((in_RDI.container)->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size = 0;
  if (in_RSI != 0) {
    __gen.randomSeed = &local_28;
    __gen.generation = &local_20;
    ::std::
    generate_n<std::back_insert_iterator<std::__cxx11::list<int,std::allocator<int>>>,unsigned_long,testinator::Arbitrary<std::__cxx11::list<int,std::allocator<int>>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              (in_RDI,(in_RSI / 100) * 5 + 5,__gen);
  }
  return in_RDI.container;
}

Assistant:

static output_type generate(std::size_t generation, unsigned long int randomSeed)
    {
      output_type v;
      if (generation == 0) return v;
      std::size_t n = N * ((generation / 100) + 1);
      std::generate_n(std::back_inserter(v), n,
                      [&] () { return Arbitrary<T>::generate(generation++, randomSeed++); });
      return v;
    }